

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  mbedtls_mpi_uint *__dest;
  ulong local_30;
  size_t i;
  mbedtls_mpi_uint *p;
  size_t nblimbs_local;
  mbedtls_mpi *X_local;
  
  if (nblimbs < 0x2711) {
    if (nblimbs < X->n) {
      local_30 = X->n;
      do {
        uVar1 = local_30;
        local_30 = uVar1 - 1;
        if (local_30 == 0) break;
      } while (X->p[local_30] == 0);
      local_30 = uVar1;
      if (uVar1 < nblimbs) {
        local_30 = nblimbs;
      }
      __dest = (mbedtls_mpi_uint *)calloc(local_30,8);
      if (__dest == (mbedtls_mpi_uint *)0x0) {
        X_local._4_4_ = -0x10;
      }
      else {
        if (X->p != (mbedtls_mpi_uint *)0x0) {
          memcpy(__dest,X->p,local_30 << 3);
          mbedtls_mpi_zeroize(X->p,X->n);
          free(X->p);
        }
        X->n = local_30;
        X->p = __dest;
        X_local._4_4_ = 0;
      }
    }
    else {
      X_local._4_4_ = mbedtls_mpi_grow(X,nblimbs);
    }
  }
  else {
    X_local._4_4_ = -0x10;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );

    if( nblimbs > MBEDTLS_MPI_MAX_LIMBS )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    /* Actually resize up if there are currently fewer than nblimbs limbs. */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );
    /* After this point, then X->n > nblimbs and in particular X->n > 0. */

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = (mbedtls_mpi_uint*)mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_mpi_zeroize( X->p, X->n );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}